

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_window.cpp
# Opt level: O3

void set_type_of_search(Am_Object *item,Am_Object *proto)

{
  bool bVar1;
  Am_Wrapper *value;
  ostream *poVar2;
  Am_Assoc as;
  Am_Object local_20;
  Am_Assoc local_18;
  
  local_18.data = (Am_Assoc_Data *)0x0;
  bVar1 = am_find_proto_and_name(proto,&local_18);
  if (bVar1) {
    Am_Object::Get_Object(&local_20,(Am_Slot_Key)item,(ulong)Am_ITEM_VALUE);
    value = Am_Object::operator_cast_to_Am_Wrapper_(proto);
    Am_Object::Set(&local_20,0x169,value,0);
    Am_Object::~Am_Object(&local_20);
    Am_Assoc::~Am_Assoc(&local_18);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"** Amulet_Error: ",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"proto ",6);
  poVar2 = operator<<((ostream *)&std::cerr,proto);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," not found in proto list ",0x19);
  poVar2 = operator<<(poVar2,&am_all_proto_names);
  std::endl<char,std::char_traits<char>>(poVar2);
  Am_Error();
}

Assistant:

void
set_type_of_search(Am_Object &item, Am_Object proto)
{
  Am_Assoc as;
  if (am_find_proto_and_name(proto, as)) {
    item.Get_Object(Am_ITEM_VALUE).Set(Am_VALUE, proto);
  } else
    Am_ERROR("proto " << proto << " not found in proto list "
                      << am_all_proto_names);
}